

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus_test.cpp
# Opt level: O2

void __thiscall
crn::corpus_tester::print_metric_stats
          (corpus_tester *this,vector<crnlib::image_utils::error_metrics> *stats,uint num_blocks_x,
          uint num_blocks_y)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  double *pdVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  pdVar7 = &stats->m_p->mPeakSNR;
  dVar15 = 0.0;
  uVar3 = 0;
  uVar4 = 0;
  uVar9 = 0;
  uVar10 = 0;
  uVar5 = 0;
  uVar8 = 0;
  dVar14 = 0.0;
  dVar13 = 0.0;
  dVar12 = 1000000.0;
  for (uVar6 = 0; stats->m_size != uVar6; uVar6 = uVar6 + 1) {
    uVar1 = (uVar6 & 0xffffffff) / (ulong)num_blocks_x;
    uVar2 = (uVar6 & 0xffffffff) % (ulong)num_blocks_x;
    dVar11 = *pdVar7;
    if (dVar11 < 200.0 && dVar15 < dVar11) {
      uVar4 = uVar2;
      dVar15 = dVar11;
      uVar3 = uVar1;
    }
    if (dVar11 < dVar12) {
      uVar10 = uVar2;
      uVar9 = uVar1;
    }
    if (200.0 <= dVar11) {
      uVar5 = (ulong)((int)uVar5 + 1);
    }
    else {
      dVar13 = dVar13 + dVar11;
      dVar14 = dVar14 + dVar11 * dVar11;
      uVar8 = uVar8 + 1;
    }
    if (dVar12 <= dVar11) {
      dVar11 = dVar12;
    }
    pdVar7 = pdVar7 + 5;
    dVar12 = dVar11;
  }
  crnlib::console::printf("Number of infinite PSNR blocks: %u",uVar5);
  crnlib::console::printf("Number of non-infinite PSNR blocks: %u",(ulong)uVar8);
  if (uVar8 != 0) {
    dVar13 = dVar13 / (double)uVar8;
    dVar14 = dVar14 / (double)uVar8 - dVar13 * dVar13;
    if (dVar14 < 0.0) {
      dVar14 = sqrt(dVar14);
    }
    else {
      dVar14 = SQRT(dVar14);
    }
    crnlib::console::printf("Average Non-Inf PSNR: %3.3f, Std dev: %3.3f",dVar13,dVar14);
    crnlib::console::printf("Worst PSNR: %3.3f, Block Location: %i,%i",dVar12,uVar10,uVar9);
    crnlib::console::printf("Best Non-Inf PSNR: %3.3f, Block Location: %i,%i",dVar15,uVar4,uVar3);
    return;
  }
  return;
}

Assistant:

void corpus_tester::print_metric_stats(const crnlib::vector<image_utils::error_metrics>& stats, uint num_blocks_x, uint num_blocks_y)
    {
        num_blocks_y;

        image_utils::error_metrics best_metrics;
        image_utils::error_metrics worst_metrics;
        worst_metrics.mPeakSNR = 1e+6f;

        vec2I best_loc;
        vec2I worst_loc;
        utils::zero_object(best_loc);
        utils::zero_object(worst_loc);

        double psnr_total = 0.0f;
        double psnr2_total = 0.0f;
        uint num_non_inf = 0;
        uint num_inf = 0;

        for (uint i = 0; i < stats.size(); i++)
        {
            uint bx = i % num_blocks_x;
            uint by = i / num_blocks_x;

            const image_utils::error_metrics& em = stats[i];

            if ((em.mPeakSNR < 200.0f) && (em > best_metrics))
            {
                best_metrics = em;
                best_loc.set(bx, by);
            }
            if (em < worst_metrics)
            {
                worst_metrics = em;
                worst_loc.set(bx, by);
            }

            if (em.mPeakSNR < 200.0f)
            {
                psnr_total += em.mPeakSNR;
                psnr2_total += em.mPeakSNR * em.mPeakSNR;
                num_non_inf++;
            }
            else
            {
                num_inf++;
            }
        }

        console::printf("Number of infinite PSNR blocks: %u", num_inf);
        console::printf("Number of non-infinite PSNR blocks: %u", num_non_inf);
        if (num_non_inf)
        {
            psnr_total /= num_non_inf;
            psnr2_total /= num_non_inf;

            double psnr_std_dev = sqrt(psnr2_total - psnr_total * psnr_total);

            console::printf("Average Non-Inf PSNR: %3.3f, Std dev: %3.3f", psnr_total, psnr_std_dev);
            console::printf("Worst PSNR: %3.3f, Block Location: %i,%i", worst_metrics.mPeakSNR, worst_loc[0], worst_loc[1]);
            console::printf("Best Non-Inf PSNR: %3.3f, Block Location: %i,%i", best_metrics.mPeakSNR, best_loc[0], best_loc[1]);
        }
    }